

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O1

QSize __thiscall QProgressBar::minimumSizeHint(QProgressBar *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QFontMetrics aQStack_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(*(long *)&(this->super_QWidget).field_0x8 + 0x26c) == 1) {
    uVar2 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
    QFontMetrics::QFontMetrics(aQStack_28,&((this->super_QWidget).data)->fnt);
    iVar1 = QFontMetrics::height();
    uVar3 = (ulong)(iVar1 + 2);
  }
  else {
    QFontMetrics::QFontMetrics(aQStack_28,&((this->super_QWidget).data)->fnt);
    iVar1 = QFontMetrics::height();
    uVar2 = (ulong)(iVar1 + 2);
    uVar3 = (**(code **)(*(long *)&this->super_QWidget + 0x70))(this);
    uVar3 = uVar3 >> 0x20;
  }
  QFontMetrics::~QFontMetrics(aQStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSize)(uVar2 & 0xffffffff | uVar3 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QProgressBar::minimumSizeHint() const
{
    QSize size;
    if (orientation() == Qt::Horizontal)
        size = QSize(sizeHint().width(), fontMetrics().height() + 2);
    else
        size = QSize(fontMetrics().height() + 2, sizeHint().height());
    return size;
}